

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.h
# Opt level: O3

void __thiscall
soplex::SPxDevexPR<double>::SPxDevexPR(SPxDevexPR<double> *this,SPxDevexPR<double> *old)

{
  SPxSolverBase<double> *pSVar1;
  
  pSVar1 = (old->super_SPxPricer<double>).thesolver;
  (this->super_SPxPricer<double>).m_name = (old->super_SPxPricer<double>).m_name;
  (this->super_SPxPricer<double>).thesolver = pSVar1;
  (this->super_SPxPricer<double>).thetolerance = (old->super_SPxPricer<double>).thetolerance;
  (this->super_SPxPricer<double>)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_SPxPricer<double>)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_SPxPricer<double>).compare.elements = (IdxElement *)0x0;
  (this->super_SPxPricer<double>)._vptr_SPxPricer = (_func_int **)&PTR_getName_0069fda0;
  this->last = old->last;
  Array<soplex::SPxPricer<double>::IdxElement>::Array(&this->prices,0);
  Array<soplex::SPxPricer<double>::IdxElement>::Array(&this->pricesCo,0);
  DIdxSet::DIdxSet(&this->bestPrices,8);
  DIdxSet::DIdxSet(&this->bestPricesCo,8);
  this->refined = false;
  return;
}

Assistant:

SPxDevexPR(const SPxDevexPR& old)
      : SPxPricer<R>(old)
      , last(old.last)
      , refined(false)
   {}